

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void imguiMaterial(cgltf_material *material)

{
  cgltf_texture *pcVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  u8 *puVar5;
  char (*in_R8) [2];
  int *in_R9;
  CStr str;
  CStr str_00;
  size_t i;
  unsigned_long local_60;
  FmtBuffer local_58;
  CStrT<char> local_40;
  
  lVar4 = (long)material - (long)parsedData->materials >> 3;
  local_60 = lVar4 * 0x7e3f1f8fc7e3f1f9;
  ImGui::Text("Name: %s",material->name);
  if (material->has_pbr_metallic_roughness != 0) {
    bVar2 = ImGui::TreeNode("PBR Metallic-Roughness");
    if (bVar2) {
      ImGui::Text("Base color factor: {%g, %g, %g, %g}",
                  (double)(material->pbr_metallic_roughness).base_color_factor[0],
                  (double)(material->pbr_metallic_roughness).base_color_factor[1],
                  (double)(material->pbr_metallic_roughness).base_color_factor[2],
                  (double)(material->pbr_metallic_roughness).base_color_factor[3]);
      ImGui::Text("Metallic factor: %g",(double)(material->pbr_metallic_roughness).metallic_factor);
      ImGui::Text("Roughness factor: %g",(double)(material->pbr_metallic_roughness).roughness_factor
                 );
      pcVar1 = (material->pbr_metallic_roughness).base_color_texture.texture;
      if (pcVar1 != (cgltf_texture *)0x0) {
        uVar3 = (ulong)((long)pcVar1 - (long)parsedData->textures) >> 3;
        local_58.start = (char *)scratch._data;
        local_58.end = (char *)scratch._data;
        local_58.size = (int)scratch._size;
        puVar5 = scratch._data;
        tl::CStrT<char>::CStrT(&local_40,"Color texture: ");
        str._str = (char *)puVar5;
        str._0_8_ = local_40._str;
        tl::toStringBufferT((tl *)&local_58,(FmtBuffer *)(ulong)local_40._size,str);
        tl::fmtBufferAppend<unsigned_long,char[4],int,char[2],int>
                  (&local_58,&local_60,
                   (char (*) [4])(&gpu::textureSizes + uVar3 * 0xccccccccccccccd),
                   (int *)((long)&gpu::textureSizes + uVar3 * 0x6666666666666668 + 4),in_R8,in_R9);
        if (local_58.size == 0) {
          local_58.end[-1] = '\0';
        }
        else {
          *local_58.end = '\0';
          local_58.end = local_58.end + 1;
          local_58.size = local_58.size + -1;
        }
        bVar2 = ImGui::TreeNode((char *)scratch._data);
        if (bVar2) {
          imguiTextureView(&(material->pbr_metallic_roughness).base_color_texture,
                           (float *)(&imgui_state::materialTexturesHeights +
                                    lVar4 * -0x1c0e070381c0e07));
          ImGui::TreePop();
        }
      }
      pcVar1 = (material->pbr_metallic_roughness).metallic_roughness_texture.texture;
      if (pcVar1 != (cgltf_texture *)0x0) {
        uVar3 = (ulong)((long)pcVar1 - (long)parsedData->textures) >> 3;
        local_58.start = (char *)scratch._data;
        local_58.end = (char *)scratch._data;
        local_58.size = (int)scratch._size;
        puVar5 = scratch._data;
        tl::CStrT<char>::CStrT(&local_40,"Metallic-roughness texture: ");
        str_00._str = (char *)puVar5;
        str_00._0_8_ = local_40._str;
        tl::toStringBufferT((tl *)&local_58,(FmtBuffer *)(ulong)local_40._size,str_00);
        tl::fmtBufferAppend<unsigned_long,char[4],int,char[2],int>
                  (&local_58,&local_60,
                   (char (*) [4])(&gpu::textureSizes + uVar3 * 0xccccccccccccccd),
                   (int *)((long)&gpu::textureSizes + uVar3 * 0x6666666666666668 + 4),in_R8,in_R9);
        if (local_58.size == 0) {
          local_58.end[-1] = '\0';
        }
        else {
          *local_58.end = '\0';
          local_58.end = local_58.end + 1;
          local_58.size = local_58.size + -1;
        }
        bVar2 = ImGui::TreeNode((char *)scratch._data);
        if (bVar2) {
          imguiTextureView(&(material->pbr_metallic_roughness).metallic_roughness_texture,
                           (float *)((long)&imgui_state::materialTexturesHeights +
                                    lVar4 * -0xe070381c0e07038 + 4));
          ImGui::TreePop();
        }
      }
      ImGui::TreePop();
    }
  }
  return;
}

Assistant:

static void imguiMaterial(const cgltf_material& material)
{
    const size_t i = getMaterialInd(&material);
    ImGui::Text("Name: %s", material.name);
    if(material.has_pbr_metallic_roughness)
    if(ImGui::TreeNode("PBR Metallic-Roughness"))
    {
        const auto& props = material.pbr_metallic_roughness;
        const auto& colorFactor = props.base_color_factor;
        ImGui::Text("Base color factor: {%g, %g, %g, %g}", colorFactor[0], colorFactor[1], colorFactor[2], colorFactor[3]);
        ImGui::Text("Metallic factor: %g", props.metallic_factor);
        ImGui::Text("Roughness factor: %g", props.roughness_factor);
        if(props.base_color_texture.texture)
        {
            const size_t texInd = getTextureInd(props.base_color_texture.texture);
            tl::toStringBuffer(scratchStr(), "Color texture: ", i, " - ", gpu::textureSizes[texInd].x, "x", gpu::textureSizes[texInd].y);
            if(ImGui::TreeNode(scratchStr())) {
                imguiTextureView(props.base_color_texture, &imgui_state::materialTexturesHeights[i].color);
                ImGui::TreePop();
            }
        }
        if(props.metallic_roughness_texture.texture)
        {
            const size_t texInd = getTextureInd(props.metallic_roughness_texture.texture);
            tl::toStringBuffer(scratchStr(), "Metallic-roughness texture: ", i, " - ", gpu::textureSizes[texInd].x, "x", gpu::textureSizes[texInd].y);
            if(ImGui::TreeNode(scratchStr())) {
                imguiTextureView(props.metallic_roughness_texture, &imgui_state::materialTexturesHeights[i].metallicRoughness);
                ImGui::TreePop();
            }
        }
        ImGui::TreePop();
    }
}